

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O2

int mg_session_write_point_2d(mg_session *session,mg_point_2d *point)

{
  int iVar1;
  
  iVar1 = mg_session_write_uint8(session,0xb3);
  if (iVar1 == 0) {
    iVar1 = mg_session_write_uint8(session,'X');
    if (iVar1 == 0) {
      iVar1 = mg_session_write_integer(session,point->srid);
      if (iVar1 == 0) {
        iVar1 = mg_session_write_float(session,point->x);
        if (iVar1 == 0) {
          iVar1 = mg_session_write_float(session,point->y);
          return iVar1;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mg_session_write_point_2d(mg_session *session, const mg_point_2d *point) {
  MG_RETURN_IF_FAILED(
      mg_session_write_uint8(session, (uint8_t)(MG_MARKER_TINY_STRUCT3)));
  MG_RETURN_IF_FAILED(mg_session_write_uint8(session, MG_SIGNATURE_POINT_2D));
  MG_RETURN_IF_FAILED(mg_session_write_integer(session, point->srid));
  MG_RETURN_IF_FAILED(mg_session_write_float(session, point->x));
  MG_RETURN_IF_FAILED(mg_session_write_float(session, point->y));
  return 0;
}